

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * lua_tolstring(lua_State *L,int idx,size_t *len)

{
  int iVar1;
  ulong local_38;
  TValue *local_30;
  StkId o;
  size_t *len_local;
  int idx_local;
  lua_State *L_local;
  
  local_30 = index2addr(L,idx);
  if ((local_30->tt_ & 0xf) != 4) {
    if ((local_30->tt_ & 0xf) != 3) {
      if (len != (size_t *)0x0) {
        *len = 0;
      }
      return (char *)0x0;
    }
    iVar1 = **(int **)&L[-1].hookmask;
    **(int **)&L[-1].hookmask = iVar1 + 1;
    if (iVar1 != 0) {
      __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x19a,"const char *lua_tolstring(lua_State *, int, size_t *)");
    }
    luaO_tostring(L,local_30);
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    local_30 = index2addr(L,idx);
    iVar1 = **(int **)&L[-1].hookmask + -1;
    **(int **)&L[-1].hookmask = iVar1;
    if (iVar1 != 0) {
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x19e,"const char *lua_tolstring(lua_State *, int, size_t *)");
    }
  }
  if (len != (size_t *)0x0) {
    if ((local_30->tt_ & 0xf) != 4) {
      __assert_fail("(((((((o))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x1a1,"const char *lua_tolstring(lua_State *, int, size_t *)");
    }
    if ((((local_30->value_).gc)->tt & 0xf) != 4) {
      __assert_fail("(((((o)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x1a1,"const char *lua_tolstring(lua_State *, int, size_t *)");
    }
    if (((local_30->value_).gc)->tt == '\x04') {
      if ((local_30->tt_ & 0xf) != 4) {
        __assert_fail("(((((((o))->tt_)) & 0x0F)) == (4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x1a1,"const char *lua_tolstring(lua_State *, int, size_t *)");
      }
      if ((((local_30->value_).gc)->tt & 0xf) != 4) {
        __assert_fail("(((((o)->value_).gc)->tt) & 0x0F) == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x1a1,"const char *lua_tolstring(lua_State *, int, size_t *)");
      }
      local_38 = (ulong)(byte)(local_30->value_).f[0xb];
    }
    else {
      if ((local_30->tt_ & 0xf) != 4) {
        __assert_fail("(((((((o))->tt_)) & 0x0F)) == (4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x1a1,"const char *lua_tolstring(lua_State *, int, size_t *)");
      }
      if ((((local_30->value_).gc)->tt & 0xf) != 4) {
        __assert_fail("(((((o)->value_).gc)->tt) & 0x0F) == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x1a1,"const char *lua_tolstring(lua_State *, int, size_t *)");
      }
      local_38 = *(ulong *)((local_30->value_).f + 0x10);
    }
    *len = local_38;
  }
  if ((local_30->tt_ & 0xf) != 4) {
    __assert_fail("(((((((o))->tt_)) & 0x0F)) == (4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x1a2,"const char *lua_tolstring(lua_State *, int, size_t *)");
  }
  if ((((local_30->value_).gc)->tt & 0xf) == 4) {
    return (char *)((local_30->value_).f + 0x18);
  }
  __assert_fail("(((((o)->value_).gc)->tt) & 0x0F) == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x1a2,"const char *lua_tolstring(lua_State *, int, size_t *)");
}

Assistant:

LUA_API const char *lua_tolstring (lua_State *L, int idx, size_t *len) {
  StkId o = index2addr(L, idx);
  if (!ttisstring(o)) {
    if (!cvt2str(o)) {  /* not convertible? */
      if (len != NULL) *len = 0;
      return NULL;
    }
    lua_lock(L);  /* 'luaO_tostring' may create a new string */
    luaO_tostring(L, o);
    luaC_checkGC(L);
    o = index2addr(L, idx);  /* previous call may reallocate the stack */
    lua_unlock(L);
  }
  if (len != NULL)
    *len = vslen(o);
  return svalue(o);
}